

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_makeleaf(uint32_t type,uint64_t value)

{
  FILE *__stream;
  size_t sVar1;
  size_t sVar2;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t index;
  int created;
  int custom;
  mtbddnode n;
  uint64_t value_local;
  uint32_t type_local;
  
  n.b = value;
  mtbddnode_makeleaf((mtbddnode_t)&created,type,value);
  index._4_4_ = sylvan_mt_has_custom_hash(type);
  if (index._4_4_ == 0) {
    local_40 = llmsset_lookup((llmsset_t_conflict)nodes,_created,n.a,(int *)&index);
  }
  else {
    local_40 = llmsset_lookupc((llmsset_t_conflict)nodes,_created,n.a,(int *)&index);
  }
  local_38 = local_40;
  if (local_40 == 0) {
    sylvan_gc_RUN();
    if (index._4_4_ == 0) {
      local_48 = llmsset_lookup((llmsset_t_conflict)nodes,_created,n.a,(int *)&index);
    }
    else {
      local_48 = llmsset_lookupc((llmsset_t_conflict)nodes,_created,n.a,(int *)&index);
    }
    __stream = _stderr;
    local_38 = local_48;
    if (local_48 == 0) {
      sVar1 = llmsset_count_marked_RUN(nodes);
      sVar2 = llmsset_get_size(nodes);
      fprintf(__stream,"BDD Unique table full, %zu of %zu buckets filled!\n",sVar1,sVar2);
      exit(1);
    }
  }
  if ((int)index == 0) {
    sylvan_stats_count(1);
  }
  else {
    sylvan_stats_count(0);
  }
  return local_38;
}

Assistant:

MTBDD
mtbdd_makeleaf(uint32_t type, uint64_t value)
{
    struct mtbddnode n;
    mtbddnode_makeleaf(&n, type, value);

    int custom = sylvan_mt_has_custom_hash(type);

    int created;
    uint64_t index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        RUN(sylvan_gc);

        index = custom ? llmsset_lookupc(nodes, n.a, n.b, &created) : llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return (MTBDD)index;
}